

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_4,_2> *
tcu::operator/(Matrix<float,_4,_2> *__return_storage_ptr__,Matrix<float,_4,_2> *mtx,float scalar)

{
  undefined1 auVar1 [16];
  Vector<float,_4> *pVVar2;
  Matrix<float,_4,_2> *res;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  auVar3._0_12_ = ZEXT812(0x3f800000);
  auVar3._12_4_ = 0;
  *(undefined1 (*) [16])(__return_storage_ptr__->m_data).m_data[0].m_data = auVar3;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 1.0;
  pVVar2 = (__return_storage_ptr__->m_data).m_data;
  pVVar2[1].m_data[2] = 0.0;
  pVVar2[1].m_data[3] = 0.0;
  auVar4._4_4_ = scalar;
  auVar4._0_4_ = scalar;
  auVar4._8_4_ = scalar;
  auVar4._12_4_ = scalar;
  auVar4 = divps(*(undefined1 (*) [16])(mtx->m_data).m_data[0].m_data,auVar4);
  *(undefined1 (*) [16])(__return_storage_ptr__->m_data).m_data[0].m_data = auVar4;
  auVar1._4_4_ = scalar;
  auVar1._0_4_ = scalar;
  auVar1._8_4_ = scalar;
  auVar1._12_4_ = scalar;
  auVar4 = divps(*(undefined1 (*) [16])(mtx->m_data).m_data[1].m_data,auVar1);
  *(undefined1 (*) [16])(__return_storage_ptr__->m_data).m_data[1].m_data = auVar4;
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows, Cols> operator/ (const Matrix<T, Rows, Cols>& mtx, T scalar)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = mtx(row, col) / scalar;
	return res;
}